

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Date.cpp
# Opt level: O3

double __thiscall asl::Date::localOffset(Date *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  tm *ptVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  time_t tm;
  long local_20;
  
  dVar9 = this->_t;
  if ((dVar9 < 0.0) || (2145916800.0 < dVar9)) {
    dVar8 = floor(dVar9 / 31556952.0 + -2.0);
    dVar9 = dVar9 - dVar8 * 31556952.0;
  }
  local_20 = (long)dVar9;
  ptVar6 = localtime(&local_20);
  if (ptVar6 == (tm *)0x0) {
    dVar9 = 0.0;
  }
  else {
    iVar1 = ptVar6->tm_yday;
    iVar7 = ptVar6->tm_hour;
    iVar2 = ptVar6->tm_year;
    ptVar6 = gmtime(&local_20);
    iVar3 = ptVar6->tm_year;
    iVar4 = ptVar6->tm_yday;
    iVar7 = iVar7 - ptVar6->tm_hour;
    if ((iVar3 < iVar2 && iVar1 < iVar4) || (iVar4 < iVar1 && iVar2 == iVar3)) {
      iVar7 = iVar7 + 0x18;
    }
    else {
      iVar5 = iVar7;
      if (iVar1 < iVar4) {
        iVar5 = iVar7 + -0x18;
      }
      if (iVar2 != iVar3) {
        iVar5 = iVar7;
      }
      iVar7 = iVar7 + -0x18;
      if (iVar1 <= iVar4) {
        iVar7 = iVar5;
      }
      if (iVar3 <= iVar2) {
        iVar7 = iVar5;
      }
    }
    dVar9 = (double)(iVar7 * 0xe10);
  }
  return dVar9;
}

Assistant:

double Date::localOffset() const
{
	double t = _t;
	if (t < 0 || t > 2145916800.0) // approximate offset out of epoch
	{
		const double y = 86400 * daysInYearAve;
		t = t - floor(t / y - 2) * y;
	}
	time_t     tm = (time_t)t;
	struct tm* tmL = localtime(&tm);
	if (!tmL)
		return 0;
	int        hL = tmL->tm_hour;
	int        dL = tmL->tm_yday;
	int        yL = tmL->tm_year;
	struct tm* tmU = gmtime(&tm);
	int        hU = tmU->tm_hour;
	int        dU = tmU->tm_yday;
	int        yU = tmU->tm_year;
	int        o = hL - hU;
	if ((yL > yU && dL < dU) || (yL == yU && dL > dU))
		o += 24;
	else if ((yL < yU && dL > dU) || (yL == yU && dL < dU))
		o -= 24;
	return o * 3600;
}